

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\x04'>::Print
          (SwitchMixin<(unsigned_char)__x04_> *this,DebugWriter *w,char16 *litbuf)

{
  ulong uVar1;
  SwitchCase *this_00;
  
  DebugWriter::EOL(w);
  DebugWriter::Indent(w);
  if (this->numCases != '\0') {
    this_00 = this->cases;
    uVar1 = 0;
    do {
      SwitchCase::Print(this_00,w);
      uVar1 = uVar1 + 1;
      this_00 = this_00 + 1;
    } while (uVar1 < this->numCases);
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void SwitchMixin<n>::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->EOL();
        w->Indent();
        for (uint8 i = 0; i < numCases; i++)
        {
            cases[i].Print(w);
        }
        w->Unindent();
    }